

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  int iVar1;
  bool local_21;
  int local_1c;
  int bMiss;
  int rc;
  int *pRc_local;
  Fts3Cursor *pCsr_local;
  
  local_1c = *pRc;
  local_21 = false;
  if (local_1c == 0) {
    _bMiss = pRc;
    pRc_local = (int *)pCsr;
    if ((pCsr->pDeferred != (Fts3DeferredToken *)0x0) &&
       (local_1c = fts3CursorSeek((sqlite3_context *)0x0,pCsr), local_1c == 0)) {
      local_1c = sqlite3Fts3CacheDeferredDoclists((Fts3Cursor *)pRc_local);
    }
    iVar1 = fts3EvalTestExpr((Fts3Cursor *)pRc_local,*(Fts3Expr **)(pRc_local + 6),&local_1c);
    local_21 = iVar1 == 0;
    sqlite3Fts3FreeDeferredDoclists((Fts3Cursor *)pRc_local);
    *_bMiss = local_1c;
  }
  local_21 = local_1c == 0 && local_21;
  return (int)local_21;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()). 
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}